

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O2

Session * __thiscall FIX::Acceptor::getSession(Acceptor *this,SessionID *sessionID)

{
  const_iterator cVar1;
  Session *pSVar2;
  
  cVar1 = std::
          _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Session_*>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Session_*>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
          ::find(&(this->m_sessions)._M_t,sessionID);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->m_sessions)._M_t._M_impl.super__Rb_tree_header) {
    pSVar2 = (Session *)0x0;
  }
  else {
    pSVar2 = (Session *)cVar1._M_node[0xb]._M_left;
  }
  return pSVar2;
}

Assistant:

Session *Acceptor::getSession(const SessionID &sessionID) const {
  Sessions::const_iterator i = m_sessions.find(sessionID);
  if (i != m_sessions.end()) {
    return i->second;
  } else {
    return 0;
  }
}